

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O1

int flatcc_verify_table_vector_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              flatcc_table_verifier_f *tvf)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  bool bVar12;
  bool bVar13;
  flatbuffers_uoffset_t base;
  flatcc_table_verifier_descriptor_t local_60;
  flatcc_table_verifier_f *local_40;
  uint local_34;
  ulong uVar7;
  
  iVar4 = get_offset_field(td,id,required,&local_34);
  if (local_34 != 0 && iVar4 == 0) {
    if (td->ttl < 1) {
LAB_001224d5:
      iVar4 = 3;
    }
    else {
      pvVar3 = td->buf;
      iVar8 = *(int *)((long)pvVar3 + (ulong)local_34);
      uVar5 = iVar8 + local_34;
      iVar4 = 0x10;
      if (local_34 < uVar5) {
        uVar1 = td->end;
        uVar9 = (ulong)uVar1;
        uVar7 = (ulong)uVar5;
        bVar13 = uVar7 + 4 <= uVar9;
        bVar12 = (uVar5 & 3) == 0;
        if (bVar12 && bVar13) {
          uVar10 = *(uint *)((long)pvVar3 + uVar7);
          if ((uVar10 < 0x40000000 && (uVar5 & 3) == 0) && (uVar10 * 4 <= (uVar1 - uVar5) - 4)) {
            iVar4 = 0;
            if (uVar10 != 0) {
              iVar11 = td->ttl + -2;
              uVar5 = iVar8 + local_34;
              iVar8 = -(iVar8 + local_34);
              local_40 = tvf;
              do {
                iVar8 = iVar8 + -4;
                uVar5 = uVar5 + 4;
                iVar4 = *(int *)((long)pvVar3 + (ulong)uVar5);
                if ((((iVar11 == 0) || (local_60.table = iVar4 + uVar5, local_60.table <= uVar5)) ||
                    (uVar9 < (ulong)local_60.table + 4)) || ((local_60.table & 3) != 0)) {
LAB_001224a3:
                  iVar4 = *(int *)((long)pvVar3 + (ulong)uVar5);
                  if (iVar11 != 0) {
                    local_60.table = iVar4 + uVar5;
                    bVar13 = true;
                    if ((uVar5 < local_60.table) && ((ulong)local_60.table + 4 <= uVar9)) {
                      bVar13 = (local_60.table & 3) != 0;
                    }
                    if (bVar13) {
                      return 0xf;
                    }
                    iVar8 = *(int *)((long)pvVar3 + (ulong)local_60.table);
                    uVar10 = (iVar4 - iVar8) + uVar5;
                    uVar7 = (ulong)uVar10;
                    if ((uVar10 & 1) != 0 || (int)uVar10 < 0) {
                      return 0x1d;
                    }
                    if (uVar9 < uVar7 + 2) {
                      return 0x1b;
                    }
                    local_60.vsize = *(ushort *)((long)pvVar3 + uVar7);
                    if ((local_60.vsize & 1) != 0 ||
                        uVar1 < ((iVar4 + (uint)local_60.vsize) - iVar8) + uVar5) {
                      return 0x1e;
                    }
                    if (3 < local_60.vsize) {
                      local_60.tsize = *(ushort *)((long)pvVar3 + uVar7 + 2);
                      if ((uint)local_60.tsize <= (uVar1 - iVar4) - uVar5) {
                        local_60.vtable = (void *)(uVar7 + (long)pvVar3);
                        local_60.buf = pvVar3;
                        local_60.end = uVar1;
                        local_60.ttl = iVar11;
                        iVar4 = (*local_40)(&local_60);
                        return iVar4;
                      }
                      return 0x14;
                    }
                    return 0x1c;
                  }
                  goto LAB_001224d5;
                }
                iVar2 = *(int *)((long)pvVar3 + (ulong)local_60.table);
                uVar6 = (iVar4 - iVar2) + uVar5;
                uVar7 = (ulong)uVar6;
                if ((((int)uVar6 < 0) || ((uVar6 & 1) != 0)) || (uVar9 < uVar7 + 2))
                goto LAB_001224a3;
                local_60.vsize = *(ushort *)((long)pvVar3 + uVar7);
                if (((local_60.vsize < 4) || ((local_60.vsize & 1) != 0)) ||
                   ((uVar1 < (((uint)local_60.vsize + iVar4) - iVar2) + uVar5 ||
                    (local_60.tsize = *(ushort *)((long)pvVar3 + uVar7 + 2),
                    (uVar1 + iVar8) - iVar4 < (uint)local_60.tsize)))) goto LAB_001224a3;
                local_60.vtable = (void *)(uVar7 + (long)pvVar3);
                local_60.buf = pvVar3;
                local_60.end = uVar1;
                local_60.ttl = iVar11;
                iVar4 = (*local_40)(&local_60);
                if (iVar4 != 0) goto LAB_001224a3;
                uVar10 = uVar10 - 1;
                iVar4 = 0;
              } while (uVar10 != 0);
            }
          }
          else if ((bVar12 && bVar13) && ((uVar5 & 3) == 0)) {
            uVar10 = *(uint *)((long)pvVar3 + uVar7);
            if (uVar10 < 0x40000000) {
              iVar4 = 0x1a;
              if (uVar10 << 2 <= (uVar1 - uVar5) - 4) {
                iVar4 = 0;
              }
            }
            else {
              iVar4 = (uint)(uVar10 >= 0x40000000) * 9 + 0x10;
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int flatcc_verify_table_vector_field(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required, flatcc_table_verifier_f tvf)
{
    uoffset_t base;

    check_field(td, id, required, base);
    return verify_table_vector(td->buf, td->end, base, read_uoffset(td->buf, base), td->ttl, tvf);
}